

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O3

Script * cfd::core::ScriptUtil::CreateMultisigRedeemScript
                   (Script *__return_storage_ptr__,uint32_t require_signature_num,
                   vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *pubkeys,
                   bool has_witness)

{
  pointer pPVar1;
  bool bVar2;
  CfdException *pCVar3;
  _func_int **pp_Var4;
  Pubkey *pubkey;
  pointer pPVar5;
  ScriptBuilder builder;
  ScriptElement op_require_num;
  ScriptElement op_pubkey_num;
  uint32_t local_134;
  ScriptBuilder local_130;
  ScriptElement local_110;
  undefined1 local_b0 [32];
  ScriptElement local_90;
  
  local_134 = require_signature_num;
  if (require_signature_num == 0) {
    local_110._vptr_ScriptElement = (_func_int **)0x2188e4;
    local_110.type_ = 0x5d1;
    local_110.op_code_._vptr_ScriptOperator = (_func_int **)0x218a26;
    logger::log<>((CfdSourceLocation *)&local_110,kCfdLogLevelWarning,
                  "Invalid require_sig_num. require_sig_num = 0");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_110._vptr_ScriptElement = (_func_int **)&local_110.op_code_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"CreateMultisigScript require_num is 0.","");
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_110);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  pPVar5 = (pubkeys->super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (pubkeys->super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pPVar5 == pPVar1) {
    local_110._vptr_ScriptElement = (_func_int **)0x2188e4;
    local_110.type_ = 0x5d7;
    local_110.op_code_._vptr_ScriptOperator = (_func_int **)0x218a26;
    logger::log<>((CfdSourceLocation *)&local_110,kCfdLogLevelWarning,"pubkey array is empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_110._vptr_ScriptElement = (_func_int **)&local_110.op_code_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"CreateMultisigScript empty pubkey array.","");
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_110);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_90._vptr_ScriptElement =
       (_func_int **)(((long)pPVar1 - (long)pPVar5 >> 3) * -0x5555555555555555);
  if (local_90._vptr_ScriptElement < (_func_int **)(ulong)require_signature_num) {
    local_110._vptr_ScriptElement = (_func_int **)0x2188e4;
    local_110.type_ = 0x5de;
    local_110.op_code_._vptr_ScriptOperator = (_func_int **)0x218a26;
    logger::log<unsigned_int&,unsigned_long&>
              ((CfdSourceLocation *)&local_110,kCfdLogLevelWarning,
               "Invalid require_sig_num. require_sig_num={0}, pubkey size={1}.",&local_134,
               (unsigned_long *)&local_90);
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_110._vptr_ScriptElement = (_func_int **)&local_110.op_code_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"CreateMultisigScript require_num is over.","");
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_110);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  pp_Var4 = (_func_int **)((ulong)has_witness * 5 + 0xf);
  if (local_90._vptr_ScriptElement < pp_Var4 ||
      (long)local_90._vptr_ScriptElement - (long)pp_Var4 == 0) {
    ScriptElement::ScriptElement(&local_110,(int64_t)(ulong)require_signature_num);
    ScriptElement::ScriptElement
              (&local_90,
               ((long)(pubkeys->
                      super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(pubkeys->
                      super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>).
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    local_130._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_00259a18;
    local_130.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_130.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_130.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ScriptBuilder::AppendElement(&local_130,&local_110);
    pPVar5 = (pubkeys->super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pPVar1 = (pubkeys->super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (pPVar5 != pPVar1) {
      do {
        ScriptBuilder::AppendData(&local_130,pPVar5);
        pPVar5 = pPVar5 + 1;
      } while (pPVar5 != pPVar1);
    }
    ScriptBuilder::AppendElement(&local_130,&local_90);
    ScriptBuilder::AppendOperator(&local_130,(ScriptOperator *)ScriptOperator::OP_CHECKMULTISIG);
    ScriptBuilder::Build(__return_storage_ptr__,&local_130);
    if (!has_witness) {
      bVar2 = IsValidRedeemScript(__return_storage_ptr__);
      if (!bVar2) {
        local_b0._0_8_ = "cfdcore_script.cpp";
        local_b0._8_4_ = 0x5f8;
        local_b0._16_8_ = "CreateMultisigRedeemScript";
        logger::log<>((CfdSourceLocation *)local_b0,kCfdLogLevelWarning,
                      "Multisig script size is over.");
        pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
        local_b0._0_8_ = local_b0 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b0,"CreateMultisigScript multisig script size is over.","");
        CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_b0);
        __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
    local_130._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_00259a18;
    if (local_130.script_byte_array_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_130.script_byte_array_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ScriptElement::~ScriptElement(&local_90);
    ScriptElement::~ScriptElement(&local_110);
    return __return_storage_ptr__;
  }
  local_110._vptr_ScriptElement = (_func_int **)0x2188e4;
  local_110.type_ = 0x5e7;
  local_110.op_code_._vptr_ScriptOperator = (_func_int **)0x218a26;
  logger::log<>((CfdSourceLocation *)&local_110,kCfdLogLevelWarning,"pubkey array size is over.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_110._vptr_ScriptElement = (_func_int **)&local_110.op_code_;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,"CreateMultisigScript pubkeys array size is over.","");
  CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_110);
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Script ScriptUtil::CreateMultisigRedeemScript(
    uint32_t require_signature_num, const std::vector<Pubkey>& pubkeys,
    bool has_witness) {
  if (require_signature_num == 0) {
    warn(CFD_LOG_SOURCE, "Invalid require_sig_num. require_sig_num = 0");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "CreateMultisigScript require_num is 0.");
  }
  if (pubkeys.empty()) {
    warn(CFD_LOG_SOURCE, "pubkey array is empty.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "CreateMultisigScript empty pubkey array.");
  }
  if (require_signature_num > pubkeys.size()) {
    warn(
        CFD_LOG_SOURCE,
        "Invalid require_sig_num. require_sig_num={0}, pubkey size={1}.",
        require_signature_num, pubkeys.size());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "CreateMultisigScript require_num is over.");
  }
  size_t max_num = (has_witness) ? Script::kMaxMultisigPubkeyNum : 15;
  if (pubkeys.size() > max_num) {
    warn(CFD_LOG_SOURCE, "pubkey array size is over.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "CreateMultisigScript pubkeys array size is over.");
  }

  ScriptElement op_require_num(static_cast<int64_t>(require_signature_num));
  ScriptElement op_pubkey_num(static_cast<int64_t>(pubkeys.size()));

  // create script
  ScriptBuilder builder;
  builder << op_require_num;
  for (const Pubkey& pubkey : pubkeys) builder << pubkey;
  builder << op_pubkey_num << ScriptOperator::OP_CHECKMULTISIG;
  Script redeem_script = builder.Build();

  if ((!has_witness) && (!IsValidRedeemScript(redeem_script))) {
    warn(CFD_LOG_SOURCE, "Multisig script size is over.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "CreateMultisigScript multisig script size is over.");
  }
  return redeem_script;
}